

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O1

void saisxx_private::
     induceSA<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> T,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> SA,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> C,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> B,long n,long k)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  
  if (C._M_current == B._M_current) {
    if (0 < k) {
      memset(C._M_current,0,k * 8);
    }
    if (0 < n) {
      lVar3 = 0;
      do {
        C._M_current[T._M_current[lVar3]] = C._M_current[T._M_current[lVar3]] + 1;
        lVar3 = lVar3 + 1;
      } while (n != lVar3);
    }
  }
  if (0 < k) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      lVar6 = C._M_current[lVar4];
      B._M_current[lVar4] = lVar3;
      lVar4 = lVar4 + 1;
      lVar3 = lVar6 + lVar3;
    } while (k != lVar4);
  }
  lVar3 = T._M_current[n + -1];
  lVar4 = B._M_current[lVar3];
  lVar6 = n + -1;
  if ((1 < n) && (T._M_current[n + -2] < lVar3)) {
    lVar6 = -n;
  }
  SA._M_current[lVar4] = lVar6;
  if (0 < n) {
    plVar5 = SA._M_current + lVar4 + 1;
    lVar4 = 0;
    do {
      uVar1 = SA._M_current[lVar4];
      SA._M_current[lVar4] = ~uVar1;
      if (0 < (long)uVar1) {
        lVar6 = T._M_current[uVar1 - 1];
        if (lVar6 != lVar3) {
          B._M_current[lVar3] = (long)plVar5 - (long)SA._M_current >> 3;
          plVar5 = SA._M_current + B._M_current[lVar6];
          lVar3 = lVar6;
        }
        lVar6 = uVar1 - 1;
        if ((uVar1 != 1) && (T._M_current[uVar1 - 2] < lVar3)) {
          lVar6 = -uVar1;
        }
        *plVar5 = lVar6;
        plVar5 = plVar5 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (n != lVar4);
  }
  if (C._M_current == B._M_current) {
    if (0 < k) {
      memset(C._M_current,0,k * 8);
    }
    if (0 < n) {
      lVar3 = 0;
      do {
        C._M_current[T._M_current[lVar3]] = C._M_current[T._M_current[lVar3]] + 1;
        lVar3 = lVar3 + 1;
      } while (n != lVar3);
    }
  }
  if (0 < k) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar3 = lVar3 + C._M_current[lVar4];
      B._M_current[lVar4] = lVar3;
      lVar4 = lVar4 + 1;
    } while (k != lVar4);
  }
  if (0 < n) {
    plVar5 = SA._M_current + *B._M_current;
    lVar3 = 0;
    do {
      uVar1 = SA._M_current[n + -1];
      if ((long)uVar1 < 1) {
        SA._M_current[n + -1] = ~uVar1;
      }
      else {
        lVar4 = T._M_current[uVar1 - 1];
        if (lVar4 != lVar3) {
          B._M_current[lVar3] = (long)plVar5 - (long)SA._M_current >> 3;
          plVar5 = SA._M_current + B._M_current[lVar4];
          lVar3 = lVar4;
        }
        lVar4 = uVar1 - 1;
        if ((lVar4 == 0) || (lVar3 < T._M_current[uVar1 - 2])) {
          lVar4 = -uVar1;
        }
        plVar5[-1] = lVar4;
        plVar5 = plVar5 + -1;
      }
      lVar4 = n + -1;
      bVar2 = 0 < n;
      n = lVar4;
    } while (lVar4 != 0 && bVar2);
  }
  return;
}

Assistant:

void
induceSA(string_type T, sarray_type SA, bucket_type C, bucket_type B,
         index_type n, index_type k) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type b;
  index_type i, j;
  char_type c0, c1;
  /* compute SAl */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, false); /* find starts of buckets */
  b = SA + B[c1 = T[j = n - 1]];
  *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
  for(i = 0; i < n; ++i) {
    j = SA[i], SA[i] = ~j;
    if(0 < j) {
      if((c0 = T[--j]) != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
    }
  }
  /* compute SAs */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, true); /* find ends of buckets */
  for(i = n - 1, b = SA + B[c1 = 0]; 0 <= i; --i) {
    if(0 < (j = SA[i])) {
      if((c0 = T[--j]) != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *--b = ((j == 0) || (T[j - 1] > c1)) ? ~j : j;
    } else {
      SA[i] = ~j;
    }
  }
}